

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,Expression *curr)

{
  uint uVar1;
  char cVar2;
  Type TVar3;
  ostream *poVar4;
  uint uVar5;
  Const *curr_00;
  Const *extraout_RDX;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  __node_gen_type __node_gen;
  
  uVar1 = this->maxDepth;
  uVar5 = this->depth + 1;
  this->depth = uVar5;
  curr_00 = (Const *)CONCAT71((int7)((ulong)curr >> 8),uVar1 != 0);
  if (uVar1 < uVar5 && uVar1 != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
    curr_00 = extraout_RDX;
  }
  uVar9 = uRam0000000000178fec;
  uVar8 = _extendLowUToI32x4;
  uVar7 = NONCONSTANT_FLOW._4_4_;
  uVar6 = (undefined4)NONCONSTANT_FLOW;
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<(anonymous namespace)::EvallingModuleRunner, wasm::Flow>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner, ReturnType = wasm::Flow]"
                 );
  }
  switch(curr->_id) {
  case BlockId:
    visitBlock(__return_storage_ptr__,this,(Block *)curr);
    break;
  case IfId:
    visitIf(__return_storage_ptr__,this,(If *)curr);
    break;
  case LoopId:
    visitLoop(__return_storage_ptr__,this,(Loop *)curr);
    break;
  case BreakId:
    visitBreak(__return_storage_ptr__,this,(Break *)curr);
    break;
  case SwitchId:
    visitSwitch(__return_storage_ptr__,this,(Switch *)curr);
    break;
  case CallId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCall
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Call *)curr);
    break;
  case CallIndirectId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCallIndirect
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (CallIndirect *)curr);
    break;
  case LocalGetId:
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)
               ((ulong)*(uint *)(curr + 1) * 0x38 + **(long **)&this[9].maxLoopIterations));
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    goto LAB_0012aea5;
  case LocalSetId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitLocalSet
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (LocalSet *)curr);
    break;
  case GlobalGetId:
    anon_unknown.dwarf_5f699::EvallingModuleRunner::visitGlobalGet
              (__return_storage_ptr__,(EvallingModuleRunner *)this,(GlobalGet *)curr);
    break;
  case GlobalSetId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitGlobalSet
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (GlobalSet *)curr);
    break;
  case LoadId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitLoad
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Load *)curr);
    break;
  case StoreId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitStore
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Store *)curr);
    break;
  case ConstId:
    visitConst(__return_storage_ptr__,
               (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)curr,curr_00);
    break;
  case UnaryId:
    visitUnary(__return_storage_ptr__,this,(Unary *)curr);
    break;
  case BinaryId:
    visitBinary(__return_storage_ptr__,this,(Binary *)curr);
    break;
  case SelectId:
    visitSelect(__return_storage_ptr__,this,(Select *)curr);
    break;
  case DropId:
    visitDrop(__return_storage_ptr__,this,(Drop *)curr);
    break;
  case ReturnId:
    visitReturn(__return_storage_ptr__,this,(Return *)curr);
    break;
  case MemorySizeId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemorySize
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (MemorySize *)curr);
    break;
  case MemoryGrowId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryGrow
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (MemoryGrow *)curr);
    break;
  case AtomicRMWId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicRMW
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (AtomicRMW *)curr);
    break;
  case AtomicCmpxchgId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicCmpxchg
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (AtomicCmpxchg *)curr);
    break;
  case AtomicWaitId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicWait
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (AtomicWait *)curr);
    break;
  case AtomicNotifyId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicNotify
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (AtomicNotify *)curr);
    break;
  case SIMDExtractId:
    visitSIMDExtract(__return_storage_ptr__,this,(SIMDExtract *)curr);
    break;
  case SIMDReplaceId:
    visitSIMDReplace(__return_storage_ptr__,this,(SIMDReplace *)curr);
    break;
  case SIMDShuffleId:
    visitSIMDShuffle(__return_storage_ptr__,this,(SIMDShuffle *)curr);
    break;
  case SIMDTernaryId:
    visitSIMDTernary(__return_storage_ptr__,this,(SIMDTernary *)curr);
    break;
  case SIMDShiftId:
    visitSIMDShift(__return_storage_ptr__,this,(SIMDShift *)curr);
    break;
  case SIMDLoadId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoad
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (SIMDLoad *)curr);
    break;
  case SIMDLoadStoreLaneId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoadStoreLane
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (SIMDLoadStoreLane *)curr);
    break;
  case MemoryInitId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryInit
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (MemoryInit *)curr);
    break;
  case DataDropId:
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this[4].maxDepth,curr + 1);
  case NopId:
  case AtomicFenceId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    break;
  case MemoryCopyId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryCopy
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (MemoryCopy *)curr);
    break;
  case MemoryFillId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitMemoryFill
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (MemoryFill *)curr);
    break;
  case PopId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitPop
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Pop *)curr);
    break;
  case RefNullId:
    visitRefNull(__return_storage_ptr__,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)curr,
                 (RefNull *)curr_00);
    break;
  case RefIsNullId:
    visitRefIsNull(__return_storage_ptr__,this,(RefIsNull *)curr);
    break;
  case RefFuncId:
    visitRefFunc(__return_storage_ptr__,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)curr,
                 (RefFunc *)curr_00);
    break;
  case RefEqId:
    visitRefEq(__return_storage_ptr__,this,(RefEq *)curr);
    break;
  case TableGetId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableGet
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableGet *)curr);
    break;
  case TableSetId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableSet
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableSet *)curr);
    break;
  case TableSizeId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableSize
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableSize *)curr);
    break;
  case TableGrowId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableGrow
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableGrow *)curr);
    break;
  case TableFillId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableFill
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableFill *)curr);
    break;
  case TableCopyId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableCopy
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableCopy *)curr);
    break;
  case TableInitId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableInit
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TableInit *)curr);
    break;
  case TryId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTry
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Try *)curr);
    break;
  case TryTableId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTryTable
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (TryTable *)curr);
    break;
  case ThrowId:
    visitThrow(__return_storage_ptr__,this,(Throw *)curr);
    break;
  case RethrowId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitRethrow
              ((Flow *)this,(ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)curr,
               (Rethrow *)curr_00);
  case UnreachableId:
    (*this->_vptr_ExpressionRunner[2])(this,"unreachable");
    wasm::handle_unreachable
              ("unreachable",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x57a);
  case ThrowRefId:
    visitThrowRef(__return_storage_ptr__,this,(ThrowRef *)curr);
    break;
  case TupleMakeId:
    visitTupleMake(__return_storage_ptr__,this,(TupleMake *)curr);
    break;
  case TupleExtractId:
    visitTupleExtract(__return_storage_ptr__,this,(TupleExtract *)curr);
    break;
  case RefI31Id:
    visitRefI31(__return_storage_ptr__,this,(RefI31 *)curr);
    break;
  case I31GetId:
    visitI31Get(__return_storage_ptr__,this,(I31Get *)curr);
    break;
  case CallRefId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitCallRef
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(CallRef *)curr
              );
    break;
  case RefTestId:
    visitRefTest(__return_storage_ptr__,this,(RefTest *)curr);
    break;
  case RefCastId:
    visitRefCast(__return_storage_ptr__,this,(RefCast *)curr);
    break;
  case BrOnId:
    visitBrOn(__return_storage_ptr__,this,(BrOn *)curr);
    break;
  case StructNewId:
    visitStructNew(__return_storage_ptr__,this,(StructNew *)curr);
    break;
  case StructGetId:
    visitStructGet(__return_storage_ptr__,this,(StructGet *)curr);
    break;
  case StructSetId:
    visitStructSet(__return_storage_ptr__,this,(StructSet *)curr);
    break;
  case StructRMWId:
    visitStructRMW(__return_storage_ptr__,this,(StructRMW *)curr);
    break;
  case StructCmpxchgId:
    visitStructCmpxchg(__return_storage_ptr__,this,(StructCmpxchg *)curr);
    break;
  case ArrayNewId:
    visitArrayNew(__return_storage_ptr__,this,(ArrayNew *)curr);
    break;
  case ArrayNewDataId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayNewData
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (ArrayNewData *)curr);
    break;
  case ArrayNewElemId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayNewElem
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (ArrayNewElem *)curr);
    break;
  case ArrayNewFixedId:
    visitArrayNewFixed(__return_storage_ptr__,this,(ArrayNewFixed *)curr);
    break;
  case ArrayGetId:
    visitArrayGet(__return_storage_ptr__,this,(ArrayGet *)curr);
    break;
  case ArraySetId:
    visitArraySet(__return_storage_ptr__,this,(ArraySet *)curr);
    break;
  case ArrayLenId:
    visitArrayLen(__return_storage_ptr__,this,(ArrayLen *)curr);
    break;
  case ArrayCopyId:
    visitArrayCopy(__return_storage_ptr__,this,(ArrayCopy *)curr);
    break;
  case ArrayFillId:
    visitArrayFill(__return_storage_ptr__,this,(ArrayFill *)curr);
    break;
  case ArrayInitDataId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayInitData
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (ArrayInitData *)curr);
    break;
  case ArrayInitElemId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitArrayInitElem
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (ArrayInitElem *)curr);
    break;
  case RefAsId:
    visitRefAs(__return_storage_ptr__,this,(RefAs *)curr);
    break;
  case StringNewId:
    visitStringNew(__return_storage_ptr__,this,(StringNew *)curr);
    break;
  case StringConstId:
    visitStringConst(__return_storage_ptr__,
                     (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)curr,
                     (StringConst *)curr_00);
    break;
  case StringMeasureId:
    visitStringMeasure(__return_storage_ptr__,this,(StringMeasure *)curr);
    break;
  case StringEncodeId:
    visitStringEncode(__return_storage_ptr__,this,(StringEncode *)curr);
    break;
  case StringConcatId:
    visitStringConcat(__return_storage_ptr__,this,(StringConcat *)curr);
    break;
  case StringEqId:
    visitStringEq(__return_storage_ptr__,this,(StringEq *)curr);
    break;
  case StringWTF16GetId:
    visitStringWTF16Get(__return_storage_ptr__,this,(StringWTF16Get *)curr);
    break;
  case StringSliceWTFId:
    visitStringSliceWTF(__return_storage_ptr__,this,(StringSliceWTF *)curr);
    break;
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0012aea5:
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) = uVar7;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str = uVar8;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) = uVar9;
    break;
  default:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
  if (((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) &&
     ((TVar3 = Literals::getType(&__return_storage_ptr__->values), 1 < TVar3.id ||
      (1 < (curr->type).id)))) {
    cVar2 = wasm::Type::isSubType(TVar3,(Type)(curr->type).id);
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
      poVar4 = (ostream *)std::operator<<(&std::cerr,this->module,(curr->type).id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", seeing ",9);
      poVar4 = (ostream *)std::operator<<(poVar4,this->module,TVar3.id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," from\n",6);
      poVar4 = (ostream *)std::operator<<(poVar4,this->module,curr);
      __node_gen._M_h._7_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)((long)&__node_gen._M_h + 7),1);
    }
    cVar2 = wasm::Type::isSubType(TVar3,(Type)(curr->type).id);
    if (cVar2 == '\0') {
      __assert_fail("Type::isSubType(type, curr->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x10b,
                    "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                   );
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }